

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O0

MPP_RET mpp_service_init(void *ctx,MppClientType type)

{
  MppClientType MVar1;
  MPP_RET MVar2;
  MppServiceCmdCap *pMVar3;
  char *__file;
  void *pvVar4;
  pthread_mutexattr_t local_34;
  RK_U32 local_30;
  pthread_mutexattr_t attr;
  RK_U32 disable_rcb_info;
  MPP_RET ret;
  MppDevMppService *p;
  void *pvStack_18;
  MppClientType type_local;
  void *ctx_local;
  
  attr.__align = -1;
  _disable_rcb_info = (MppClientType *)ctx;
  p._4_4_ = type;
  pvStack_18 = ctx;
  pMVar3 = mpp_get_mpp_service_cmd_cap();
  *(MppServiceCmdCap **)(_disable_rcb_info + 0x60) = pMVar3;
  __file = mpp_get_mpp_service_name();
  MVar1 = open64(__file,0x80002);
  _disable_rcb_info[1] = MVar1;
  if ((int)_disable_rcb_info[1] < 0) {
    _mpp_log_l(2,"mpp_serivce","open mpp_service failed\n",(char *)0x0);
    ctx_local._4_4_ = attr;
  }
  else {
    attr.__align = mpp_service_ioctl(_disable_rcb_info[1],0x100,4,(void *)((long)&p + 4));
    if (attr.__align != 0) {
      _mpp_log_l(2,"mpp_serivce","set client type %d failed\n",(char *)0x0,(ulong)p._4_4_);
    }
    if ((*(undefined8 *)(_disable_rcb_info + 0x60) == VPU_CLIENT_VDPU1) &&
       (_mpp_log_l(2,"mpp_serivce","Assertion %s failed at %s:%d\n",(char *)0x0,"p->cap",
                   "mpp_service_init",0x144), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    MVar2 = mpp_service_check_cmd_valid(0x403,*(MppServiceCmdCap **)(_disable_rcb_info + 0x60));
    if (MVar2 == MPP_OK) {
      _disable_rcb_info[0x62] = VPU_CLIENT_VDPU2;
    }
    MVar2 = mpp_service_check_cmd_valid(0x203,*(MppServiceCmdCap **)(_disable_rcb_info + 0x60));
    if (MVar2 == MPP_OK) {
      local_30 = 0;
      mpp_env_get_u32("disable_rcb_info",&local_30,0);
      _disable_rcb_info[99] = (uint)((local_30 != 0 ^ 0xffU) & 1);
    }
    MVar2 = mpp_service_check_cmd_valid(0x301,*(MppServiceCmdCap **)(_disable_rcb_info + 0x60));
    if (MVar2 == MPP_OK) {
      _disable_rcb_info[100] = VPU_CLIENT_VDPU2;
    }
    *_disable_rcb_info = p._4_4_;
    _disable_rcb_info[2] = _disable_rcb_info[1];
    _disable_rcb_info[6] = VPU_CLIENT_VDPU1;
    _disable_rcb_info[4] = VPU_CLIENT_VDPU1;
    _disable_rcb_info[5] = VPU_CLIENT_VDPU1;
    _disable_rcb_info[8] = VPU_CLIENT_VDPU1;
    _disable_rcb_info[9] = VPU_CLIENT_VDPU1;
    _disable_rcb_info[0x1a] = VPU_CLIENT_VDPU1;
    _disable_rcb_info[0x1b] = VPU_CLIENT_VDPU1;
    _disable_rcb_info[0x1c] = _disable_rcb_info[1];
    _disable_rcb_info[0x1d] = VPU_CLIENT_VDPU1;
    _disable_rcb_info[0xc] = VPU_CLIENT_RKVENC;
    pvVar4 = mpp_osal_malloc("mpp_service_init",(long)(int)_disable_rcb_info[0xc] * 0x18);
    *(void **)(_disable_rcb_info + 10) = pvVar4;
    if (*(undefined8 *)(_disable_rcb_info + 10) == VPU_CLIENT_VDPU1) {
      _mpp_log_l(2,"mpp_serivce","create request buffer failed\n",(char *)0x0);
      attr.__align = -4;
    }
    _disable_rcb_info[0x10] = 0x40;
    pvVar4 = mpp_osal_malloc("mpp_service_init",(long)(int)_disable_rcb_info[0x10] << 3);
    *(void **)(_disable_rcb_info + 0xe) = pvVar4;
    if (*(undefined8 *)(_disable_rcb_info + 0xe) == VPU_CLIENT_VDPU1) {
      _mpp_log_l(2,"mpp_serivce","create register offset buffer failed\n",(char *)0x0);
      attr.__align = -4;
    }
    _disable_rcb_info[0x12] = VPU_CLIENT_VDPU1;
    _disable_rcb_info[0x11] = VPU_CLIENT_VDPU1;
    _disable_rcb_info[0x16] = 0x20;
    pvVar4 = mpp_osal_malloc("mpp_service_init",(long)(int)_disable_rcb_info[0x16] << 3);
    *(void **)(_disable_rcb_info + 0x14) = pvVar4;
    if (*(undefined8 *)(_disable_rcb_info + 0x14) == VPU_CLIENT_VDPU1) {
      _mpp_log_l(2,"mpp_serivce","create rcb info buffer failed\n",(char *)0x0);
      attr.__align = -4;
    }
    _disable_rcb_info[0x18] = VPU_CLIENT_VDPU1;
    _disable_rcb_info[0x17] = VPU_CLIENT_VDPU1;
    *(MppClientType **)(_disable_rcb_info + 0x70) = _disable_rcb_info + 0x70;
    *(MppClientType **)(_disable_rcb_info + 0x72) = _disable_rcb_info + 0x70;
    pthread_mutexattr_init(&local_34);
    pthread_mutexattr_settype(&local_34,1);
    pthread_mutex_init((pthread_mutex_t *)(_disable_rcb_info + 0x66),&local_34);
    pthread_mutexattr_destroy(&local_34);
    ctx_local._4_4_ = attr;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET mpp_service_init(void *ctx, MppClientType type)
{
    MppDevMppService *p = (MppDevMppService *)ctx;
    MPP_RET ret = MPP_NOK;

    p->cap = mpp_get_mpp_service_cmd_cap();
    p->client = open(mpp_get_mpp_service_name(), O_RDWR | O_CLOEXEC);
    if (p->client < 0) {
        mpp_err("open mpp_service failed\n");
        return ret;
    }

    /* set client type first */
    ret = mpp_service_ioctl(p->client, MPP_CMD_INIT_CLIENT_TYPE, sizeof(type), &type);
    if (ret)
        mpp_err("set client type %d failed\n", type);

    mpp_assert(p->cap);
    if (MPP_OK == mpp_service_check_cmd_valid(MPP_CMD_SEND_CODEC_INFO, p->cap))
        p->support_set_info = 1;
    if (MPP_OK == mpp_service_check_cmd_valid(MPP_CMD_SET_RCB_INFO, p->cap)) {
        RK_U32 disable_rcb_info = 0;

        mpp_env_get_u32("disable_rcb_info", &disable_rcb_info, 0);
        p->support_set_rcb_info = !disable_rcb_info;
    }
    if (MPP_OK == mpp_service_check_cmd_valid(MPP_CMD_POLL_HW_IRQ, p->cap))
        p->support_hw_irq = 1;

    /* default server fd is the opened client fd */
    p->client_type = type;
    p->server = p->client;
    p->batch_io = 0;
    p->serv_ctx = NULL;
    p->dev_cb   = NULL;

    p->bat_cmd.flag = 0;
    p->bat_cmd.client = p->client;
    p->bat_cmd.ret = 0;

    p->req_max = MAX_REQ_NUM;
    p->reqs = mpp_malloc(MppReqV1, p->req_max);
    if (NULL == p->reqs) {
        mpp_err("create request buffer failed\n");
        ret = MPP_ERR_MALLOC;
    }

    p->reg_offset_max = MAX_REG_OFFSET;
    p->reg_offset_info = mpp_malloc(RegOffsetInfo, p->reg_offset_max);
    if (NULL == p->reg_offset_info) {
        mpp_err("create register offset buffer failed\n");
        ret = MPP_ERR_MALLOC;
    }
    p->reg_offset_pos = 0;
    p->reg_offset_count = 0;

    p->rcb_max = MAX_RCB_OFFSET;
    p->rcb_info = mpp_malloc(RcbInfo, p->rcb_max);
    if (NULL == p->rcb_info) {
        mpp_err("create rcb info buffer failed\n");
        ret = MPP_ERR_MALLOC;
    }
    p->rcb_pos = 0;
    p->rcb_count = 0;

    INIT_LIST_HEAD(&p->list_bufs);
    {
        pthread_mutexattr_t attr;
        pthread_mutexattr_init(&attr);
        pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
        pthread_mutex_init(&p->lock_bufs, &attr);
        pthread_mutexattr_destroy(&attr);
    }
    return ret;
}